

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall despot::NamedVar::~NamedVar(NamedVar *this)

{
  ~NamedVar(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

NamedVar::~NamedVar() {
}